

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O3

void __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
::emplace<helics::route_id_const&,helics::ActionMessage>
          (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
           *this,route_id *args,ActionMessage *args_1)

{
  vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
  *this_00;
  bool bVar1;
  unique_lock<std::mutex> pushLock;
  unique_lock<std::mutex> pullLock;
  unique_lock<std::mutex> local_40;
  unique_lock<std::mutex> local_30;
  
  local_40._M_owns = false;
  local_40._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  this_00 = (vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
             *)(this + 0x50);
  if (*(long *)(this + 0x50) == *(long *)(this + 0x58)) {
    LOCK();
    bVar1 = this[0x80] ==
            (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
             )0x1;
    if (bVar1) {
      this[0x80] = (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                    )0x0;
    }
    UNLOCK();
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock(&local_40);
      local_30._M_device = (mutex_type *)(this + 0x28);
      local_30._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_30);
      local_30._M_owns = true;
      LOCK();
      this[0x80] = (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                    )0x0;
      UNLOCK();
      if (*(long *)(this + 0x68) == *(long *)(this + 0x70)) {
        this_00 = (vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
                   *)(this + 0x68);
      }
      else {
        std::unique_lock<std::mutex>::lock(&local_40);
      }
      std::
      vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
      ::emplace_back<helics::route_id_const&,helics::ActionMessage>(this_00,args,args_1);
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock(&local_30);
    }
    else {
      std::
      vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
      ::emplace_back<helics::route_id_const&,helics::ActionMessage>(this_00,args,args_1);
      LOCK();
      bVar1 = this[0x80] ==
              (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
               )0x1;
      if (bVar1) {
        this[0x80] = (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                      )0x0;
      }
      UNLOCK();
      if (bVar1) {
        std::condition_variable::notify_all();
      }
    }
  }
  else {
    std::
    vector<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>
    ::emplace_back<helics::route_id_const&,helics::ActionMessage>(this_00,args,args_1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void emplace(Args&&... args)
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                bool expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    // release the push lock so we don't get a potential
                    // deadlock condition
                    pushLock.unlock();
                    std::unique_lock<MUTEX> pullLock(
                        m_pullLock);  // first pullLock
                    queueEmptyFlag = false;  // need to set the flag again after
                                             // we get the lock
                    if (pullElements.empty()) {
                        pullElements.emplace_back(std::forward<Args>(args)...);
                    } else {
                        pushLock.lock();
                        pushElements.emplace_back(std::forward<Args>(args)...);
                    }

                    condition.notify_all();
                    return;
                } else {
                    pushElements.emplace_back(std::forward<Args>(args)...);
                    expEmpty = true;
                    if (queueEmptyFlag.compare_exchange_strong(
                            expEmpty, false)) {
                        condition.notify_all();
                    }
                    return;
                }
            }
            pushElements.emplace_back(std::forward<Args>(args)...);
        }